

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O3

AtomType * __thiscall OpenMD::ForceField::getAtomType(ForceField *this,int ident)

{
  _Base_ptr p_Var1;
  AtomType *pAVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  string at;
  string local_38;
  
  p_Var4 = (this->atypeIdentToName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->atypeIdentToName)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = p_Var1;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      if (ident <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < ident];
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color <= ident)) {
      p_Var1 = p_Var3;
    }
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,p_Var1[1]._M_parent,
             (long)&(p_Var1[1]._M_parent)->_M_color + (long)&(p_Var1[1]._M_left)->_M_color);
  pAVar2 = getAtomType(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pAVar2;
}

Assistant:

AtomType* ForceField::getAtomType(int ident) {
    std::string at = atypeIdentToName.find(ident)->second;
    return getAtomType(at);
  }